

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> * __thiscall
google::protobuf::Map<long,_double>::InnerMap::
iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::operator++
          (iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> *this)

{
  bool bVar1;
  LogMessage *other;
  _Self *__x;
  reference pplVar2;
  Node *pNVar3;
  _Self local_80;
  set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  *local_78;
  Tree *tree;
  byte local_59;
  LogMessage local_58;
  undefined1 local_19;
  bool is_list;
  TreeIterator tree_it;
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> *this_local;
  
  if (this->node_->next == (Node *)0x0) {
    tree_it._M_node = (_Base_ptr)this;
    std::_Rb_tree_const_iterator<long_*>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<long_*> *)&stack0xffffffffffffffe8);
    local_19 = revalidate_if_necessary(this,(TreeIterator *)&stack0xffffffffffffffe8);
    if ((bool)local_19) {
      SearchFrom(this,this->bucket_index_ + 1);
    }
    else {
      local_59 = 0;
      if ((this->bucket_index_ & 1) != 0) {
        internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x1b2);
        local_59 = 1;
        other = internal::LogMessage::operator<<
                          (&local_58,"CHECK failed: (bucket_index_ & 1) == (0): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),other);
      }
      if ((local_59 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_58);
      }
      local_78 = (set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
                  *)this->m_->table_[this->bucket_index_];
      __x = std::_Rb_tree_const_iterator<long_*>::operator++
                      ((_Rb_tree_const_iterator<long_*> *)&stack0xffffffffffffffe8);
      local_80._M_node =
           (_Base_ptr)
           std::
           set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
           ::end(local_78);
      bVar1 = std::operator==(__x,&local_80);
      if (bVar1) {
        SearchFrom(this,this->bucket_index_ + 2);
      }
      else {
        pplVar2 = std::_Rb_tree_const_iterator<long_*>::operator*
                            ((_Rb_tree_const_iterator<long_*> *)&stack0xffffffffffffffe8);
        pNVar3 = NodePtrFromKeyPtr(*pplVar2);
        this->node_ = pNVar3;
      }
    }
  }
  else {
    this->node_ = this->node_->next;
  }
  return this;
}

Assistant:

iterator_base& operator++() {
        if (node_->next == NULL) {
          TreeIterator tree_it;
          const bool is_list = revalidate_if_necessary(&tree_it);
          if (is_list) {
            SearchFrom(bucket_index_ + 1);
          } else {
            GOOGLE_DCHECK_EQ(bucket_index_ & 1, 0);
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            if (++tree_it == tree->end()) {
              SearchFrom(bucket_index_ + 2);
            } else {
              node_ = NodePtrFromKeyPtr(*tree_it);
            }
          }
        } else {
          node_ = node_->next;
        }
        return *this;
      }